

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O2

void SubTest(void)

{
  ostream *poVar1;
  bool a;
  bool b;
  
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SubTest() {
    bool a = 3;
    bool b = 4;
    auto x = &a - &b;
    cout << x << endl;

    cout << &a << endl;
    cout << (&a + 1) << endl;

    auto a1 = &a;
    auto a2 = (&a + 1);
    cout << a1 << ' ' << a2 << endl;
}